

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

string * __thiscall
diligent_spirv_cross::CompilerGLSL::to_flattened_access_chain_expression_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,uint32_t id)

{
  Variant *pVVar1;
  SPIRVariable *pSVar2;
  SPIRExpression *pSVar3;
  ulong uVar4;
  string local_48;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar4 = (ulong)id;
  if ((uVar4 < (this->super_Compiler).ir.ids.super_VectorView<diligent_spirv_cross::Variant>.
               buffer_size) &&
     (pVVar1 = (this->super_Compiler).ir.ids.super_VectorView<diligent_spirv_cross::Variant>.ptr,
     pVVar1[uVar4].type == TypeVariable)) {
    pSVar2 = Variant::get<diligent_spirv_cross::SPIRVariable>(pVVar1 + uVar4);
  }
  else {
    pSVar2 = (SPIRVariable *)0x0;
  }
  if (pSVar2 == (SPIRVariable *)0x0) {
    if ((uVar4 < (this->super_Compiler).ir.ids.super_VectorView<diligent_spirv_cross::Variant>.
                 buffer_size) &&
       (pVVar1 = (this->super_Compiler).ir.ids.super_VectorView<diligent_spirv_cross::Variant>.ptr,
       pVVar1[uVar4].type == TypeExpression)) {
      pSVar3 = Variant::get<diligent_spirv_cross::SPIRExpression>(pVVar1 + uVar4);
    }
    else {
      pSVar3 = (SPIRExpression *)0x0;
    }
    if (pSVar3 != (SPIRExpression *)0x0) {
      ::std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    to_expression_abi_cxx11_(&local_48,this,id,true);
  }
  else {
    (*(this->super_Compiler)._vptr_Compiler[6])
              (&local_48,this,(ulong)(pSVar2->super_IVariant).self.id,1);
  }
  ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CompilerGLSL::to_flattened_access_chain_expression(uint32_t id)
{
	// Do not use to_expression as that will unflatten access chains.
	string basename;
	if (const auto *var = maybe_get<SPIRVariable>(id))
		basename = to_name(var->self);
	else if (const auto *expr = maybe_get<SPIRExpression>(id))
		basename = expr->expression;
	else
		basename = to_expression(id);

	return basename;
}